

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  char cVar8;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar5 = stbi__jpeg_huff_decode(j,hdc);
  if (uVar5 < 0x10) {
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = stbi__extend_receive(j,uVar5);
    }
    uVar3 = j->img_comp[b].dc_pred;
    if (-1 < (int)(uVar3 ^ uVar5)) {
      bVar4 = (int)uVar3 <= (int)(uVar5 ^ 0x7fffffff);
      if ((int)(uVar3 & uVar5) < 0) {
        bVar4 = (int)(-0x80000000 - uVar5) <= (int)uVar3;
      }
      if (!bVar4) {
        pcVar7 = "bad delta";
        goto LAB_0011869f;
      }
    }
    iVar9 = uVar3 + uVar5;
    j->img_comp[b].dc_pred = iVar9;
    uVar2 = *dequant;
    if (uVar2 != 0) {
      if (iVar9 < 0) {
        bVar4 = -0x8000 / (int)(uint)uVar2 <= iVar9;
      }
      else {
        bVar4 = iVar9 <= (int)(0x7fff / uVar2);
      }
      if (!bVar4) {
        pcVar7 = "can\'t merge dc and ac";
        goto LAB_0011869f;
      }
    }
    *data = uVar2 * (short)iVar9;
    iVar9 = 1;
    do {
      if (j->code_bits < 0x10) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar2 = fac[j->code_buffer >> 0x17];
      if (uVar2 == 0) {
        uVar5 = stbi__jpeg_huff_decode(j,hac);
        if ((int)uVar5 < 0) goto LAB_00118652;
        if ((uVar5 & 0xf) != 0) {
          lVar10 = (long)iVar9 + (ulong)(uVar5 >> 4);
          iVar9 = (int)lVar10;
          bVar1 = ""[lVar10];
          iVar6 = stbi__extend_receive(j,uVar5 & 0xf);
          *(short *)((long)data + (ulong)((uint)bVar1 * 2)) =
               (short)iVar6 * *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
          goto LAB_0011864e;
        }
        iVar6 = iVar9 + 0x10;
        if (uVar5 != 0xf0) {
          iVar6 = iVar9;
        }
        iVar9 = iVar6;
        cVar8 = (uVar5 != 0xf0) * '\x02';
      }
      else {
        iVar9 = iVar9 + (uVar2 >> 4 & 0xf);
        uVar5 = uVar2 & 0xf;
        if (j->code_bits < (int)uVar5) {
LAB_00118652:
          *(char **)(in_FS_OFFSET + -8) = "bad huffman code";
          cVar8 = '\x01';
        }
        else {
          j->code_buffer = j->code_buffer << (sbyte)uVar5;
          j->code_bits = j->code_bits - uVar5;
          *(short *)((long)data + (ulong)((uint)""[iVar9] * 2)) =
               (short)(char)(uVar2 >> 8) * *(short *)((long)dequant + (ulong)((uint)""[iVar9] * 2));
LAB_0011864e:
          iVar9 = iVar9 + 1;
          cVar8 = '\0';
        }
      }
      iVar6 = 1;
      if (cVar8 != '\0') {
        if (cVar8 == '\x02') {
          return 1;
        }
        goto LAB_001186a8;
      }
    } while (iVar9 < 0x40);
  }
  else {
    pcVar7 = "bad huffman code";
LAB_0011869f:
    *(char **)(in_FS_OFFSET + -8) = pcVar7;
LAB_001186a8:
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0 || t > 15) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta","Corrupt JPEG");
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   if (!stbi__mul2shorts_valid(dc, dequant[0])) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         if (s > j->code_bits) return stbi__err("bad huffman code", "Combined length longer than code bits available");
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}